

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlines.cpp
# Opt level: O2

int main(void)

{
  Am_Slot_Key AVar1;
  ushort uVar2;
  Am_Wrapper *pAVar3;
  Am_Object *pAVar4;
  Am_Object AVar5;
  ulong uVar6;
  Am_Slot_Flags flags;
  Am_Object line_inst;
  Am_Object group;
  Am_Object stander;
  Am_Object copy;
  Am_Object instance;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object window;
  Am_Object local_18;
  
  Am_Initialize();
  Am_Object::Create((char *)&group);
  uVar2 = Am_Object::Set((ushort)&group,0x8b,0);
  uVar2 = Am_Object::Set(uVar2,0x8c,0);
  uVar2 = Am_Object::Set(uVar2,0x8d,100);
  uVar2 = Am_Object::Set(uVar2,0x8e,100);
  pAVar3 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Black);
  pAVar4 = (Am_Object *)Am_Object::Add(uVar2,(Am_Wrapper *)0x6a,(ulong)pAVar3);
  Am_Object::operator=(&line,pAVar4);
  Am_Object::~Am_Object(&group);
  Am_Object::Create((char *)&instance);
  uVar2 = Am_Object::Set((ushort)&instance,100,5);
  uVar2 = Am_Object::Set(uVar2,0x65,5);
  uVar2 = Am_Object::Set(uVar2,0x66,100);
  uVar2 = Am_Object::Set(uVar2,0x67,100);
  AVar1 = LINE1;
  Am_Object::Am_Object(&local_18,&line);
  AVar5.data._2_6_ = 0;
  AVar5.data._0_2_ = AVar1;
  pAVar4 = (Am_Object *)Am_Object::Add_Part(uVar2,AVar5,(ulong)&local_18);
  Am_Object::Am_Object(&group,pAVar4);
  Am_Object::~Am_Object(&local_18);
  Am_Object::~Am_Object(&instance);
  Am_Object::Create((char *)&copy);
  uVar2 = Am_Object::Set((ushort)&copy,100,5);
  pAVar4 = (Am_Object *)Am_Object::Set(uVar2,0x65,0x6e);
  Am_Object::Am_Object(&instance,pAVar4);
  Am_Object::~Am_Object(&copy);
  Am_Object::Copy((char *)&stander);
  uVar2 = Am_Object::Set((ushort)&stander,100,0x6e);
  pAVar4 = (Am_Object *)Am_Object::Set(uVar2,0x65,5);
  Am_Object::Am_Object(&copy,pAVar4);
  Am_Object::~Am_Object(&stander);
  Am_Object::Create((char *)&line_inst);
  uVar2 = Am_Object::Set((ushort)&line_inst,100,0x6e);
  pAVar4 = (Am_Object *)Am_Object::Set(uVar2,0x65,0x6e);
  Am_Object::Am_Object(&stander,pAVar4);
  Am_Object::~Am_Object(&line_inst);
  Am_Object::Get_Object((ushort)&line_inst,(ulong)&stander);
  Am_Object::Set((ushort)&line_inst,0x8b,0);
  Am_Object::Set((ushort)&line_inst,0x8c,0);
  Am_Object::Set((ushort)&line_inst,0x8d,100);
  Am_Object::Set((ushort)&line_inst,0x8e,100);
  Am_Object::Create((char *)&local_28);
  pAVar3 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Motif_Gray);
  uVar2 = Am_Object::Set((ushort)&local_28,(Am_Wrapper *)0x6a,(ulong)pAVar3);
  uVar2 = Am_Object::Set(uVar2,100,0x32);
  uVar2 = Am_Object::Set(uVar2,0x65,100);
  uVar2 = Am_Object::Set(uVar2,0x66,0xd7);
  uVar2 = Am_Object::Set(uVar2,0x67,0xd7);
  AVar5.data = (Am_Object_Data *)Am_Object::Set(uVar2,(char *)0x6c,0x103071);
  Am_Object::Am_Object(&local_30,&group);
  AVar5.data = (Am_Object_Data *)Am_Object::Add_Part(AVar5,SUB81(&local_30,0),1);
  Am_Object::Am_Object(&local_38,&instance);
  AVar5.data = (Am_Object_Data *)Am_Object::Add_Part(AVar5,SUB81(&local_38,0),1);
  Am_Object::Am_Object(&local_40,&copy);
  AVar5.data = (Am_Object_Data *)Am_Object::Add_Part(AVar5,SUB81(&local_40,0),1);
  Am_Object::Am_Object(&local_48,&stander);
  AVar5.data = (Am_Object_Data *)Am_Object::Add_Part(AVar5,SUB81(&local_48,0),1);
  Am_Object::Create((char *)&local_60);
  uVar2 = Am_Object::Set((ushort)&local_60,(char *)0xb9,0x103096);
  uVar6 = Am_Object::Set(uVar2,0xcb,0);
  Am_Object::Get_Object((ushort)&local_58,uVar6);
  flags = Am_Object::Set((ushort)&local_58,(Am_Method_Wrapper *)0xca,
                         (ulong)change_setting.from_wrapper);
  Am_Object::Get_Owner(&local_50,flags);
  pAVar4 = (Am_Object *)Am_Object::Add_Part(AVar5,SUB81(&local_50,0),1);
  Am_Object::Am_Object(&window,pAVar4);
  Am_Object::~Am_Object(&local_50);
  Am_Object::~Am_Object(&local_58);
  Am_Object::~Am_Object(&local_60);
  Am_Object::~Am_Object(&local_48);
  Am_Object::~Am_Object(&local_40);
  Am_Object::~Am_Object(&local_38);
  Am_Object::~Am_Object(&local_30);
  Am_Object::~Am_Object(&local_28);
  Am_Object::Am_Object(&local_68,&window);
  Am_Object::Add_Part((Am_Object_Data *)&Am_Screen,SUB81(&local_68,0),1);
  Am_Object::~Am_Object(&local_68);
  Am_Main_Event_Loop();
  Am_Cleanup();
  Am_Object::~Am_Object(&window);
  Am_Object::~Am_Object(&line_inst);
  Am_Object::~Am_Object(&stander);
  Am_Object::~Am_Object(&copy);
  Am_Object::~Am_Object(&instance);
  Am_Object::~Am_Object(&group);
  return 0;
}

Assistant:

int
main()
{
  Am_Initialize();

  line = Am_Line.Create("the line")
             .Set(Am_X1, 0)
             .Set(Am_Y1, 0)
             .Set(Am_X2, 100)
             .Set(Am_Y2, 100)
             .Add(Am_FILL_STYLE, Am_Black);

  Am_Object group = Am_Group.Create("group")
                        .Set(Am_LEFT, 5)
                        .Set(Am_TOP, 5)
                        .Set(Am_WIDTH, 100)
                        .Set(Am_HEIGHT, 100)
                        .Add_Part(LINE1, line);

  Am_Object instance =
      group.Create("instance").Set(Am_LEFT, 5).Set(Am_TOP, 110);

  Am_Object copy = group.Copy().Set(Am_LEFT, 110).Set(Am_TOP, 5);

  Am_Object stander =
      group.Create("stander").Set(Am_LEFT, 110).Set(Am_TOP, 110);
  Am_Object line_inst = stander.Get_Object(LINE1);
  line_inst.Set(Am_X1, 0);
  line_inst.Set(Am_Y1, 0);
  line_inst.Set(Am_X2, 100);
  line_inst.Set(Am_Y2, 100);

  Am_Object window = Am_Window.Create("window")
                         .Set(Am_FILL_STYLE, Am_Motif_Gray)
                         .Set(Am_LEFT, 50)
                         .Set(Am_TOP, 100)
                         .Set(Am_WIDTH, 215)
                         .Set(Am_HEIGHT, 215)
                         .Set(Am_TITLE, "Test Line Inheritance")
                         .Add_Part(group)
                         .Add_Part(instance)
                         .Add_Part(copy)
                         .Add_Part(stander)
                         .Add_Part(Am_Choice_Interactor.Create("keyboard press")
                                       .Set(Am_START_WHEN, "ANY_KEYBOARD")
                                       .Set(Am_CONTINUOUS, 0)
                                       .Get_Object(Am_COMMAND)
                                       .Set(Am_DO_METHOD, change_setting)
                                       .Get_Owner());
  Am_Screen.Add_Part(window);

  Am_Main_Event_Loop();
  Am_Cleanup();

  return 0;
}